

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::WriteDeltaFor
               (unsigned_long *values,bool *validity,bitpacking_width_t width,
               unsigned_long frame_of_reference,long delta_offset,unsigned_long *original_values,
               idx_t count,void *data_ptr)

{
  atomic<unsigned_long> *paVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  pointer pCVar6;
  idx_t iVar7;
  ulong uVar8;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar9;
  unsigned_long *in;
  ulong uVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t local_138 [33];
  
  iVar7 = count;
  if ((count & 0x1f) != 0) {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar7 = (count - uVar5) + 0x20;
  }
  uVar10 = (ulong)width;
  uVar8 = iVar7 * uVar10 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,uVar8 + 0x18,4);
  iVar2 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar4 = *(long *)((long)data_ptr + 0x48);
  iVar3 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar4 + -4;
  *(uint *)(lVar4 + -4) = iVar2 - iVar3 | 0x4000000;
  puVar11 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar11 = frame_of_reference;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar11 + 1;
  puVar11[1] = uVar10;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar11 + 2;
  puVar11[2] = delta_offset;
  puVar11 = puVar11 + 3;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar11;
  uVar13 = count & 0xffffffffffffffe0;
  if (uVar13 != 0) {
    uVar9 = 0;
    uVar12 = 0;
    in = values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)puVar11),(uint)width);
      uVar12 = uVar12 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar12 < uVar13);
  }
  if ((count & 0x1f) != 0) {
    uVar9 = (ulong)(((uint)count & 0x1f) << 3);
    switchD_0105dc25::default((void *)((long)local_138 + uVar9),0,0x100 - uVar9);
    switchD_01602a8a::default(local_138,values + uVar13,uVar9);
    duckdb_fastpforlib::fastpack
              (local_138,(uint32_t *)((long)puVar11 + (uVar10 * uVar13 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar8;
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}